

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

void __thiscall
cs::method_import::preprocess
          (method_import *this,context_t *context,
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          *raw)

{
  token_base *ptVar1;
  value_type ptVar2;
  _Elt_pointer pdVar3;
  int iVar4;
  const_reference pptVar5;
  token_base **pptVar6;
  statement_import *this_00;
  _Elt_pointer pptVar7;
  internal_error *this_01;
  size_t sVar8;
  value_type ptVar9;
  value_type ptVar10;
  tree_type<cs::token_base_*> *t;
  value_type t_00;
  value_type ptVar11;
  iterator local_a0;
  anon_class_16_2_05505a5e process;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>_>_>
  var_list;
  __shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2> local_58;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>_>_>
  local_48;
  
  ptVar9 = (value_type)0x1;
  pptVar5 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::at
                      ((raw->
                       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                       )._M_impl.super__Deque_impl_data._M_start._M_cur,1);
  ptVar10 = *pptVar5;
  var_list.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)ptVar10[1]._vptr_token_base;
  pptVar6 = tree_type<cs::token_base_*>::iterator::data((iterator *)&var_list);
  if (*pptVar6 != (token_base *)0x0) {
    ptVar10 = ptVar10 + 1;
    var_list.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    var_list.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    var_list.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_a0.mData = (tree_node *)ptVar10->_vptr_token_base;
    process.context = context;
    process.var_list = &var_list;
    pptVar6 = tree_type<cs::token_base_*>::iterator::data(&local_a0);
    iVar4 = (*(*pptVar6)->_vptr_token_base[2])();
    if (iVar4 == 0xf) {
      local_a0.mData = (tree_node *)ptVar10->_vptr_token_base;
      pptVar6 = tree_type<cs::token_base_*>::iterator::data(&local_a0);
      ptVar1 = *pptVar6;
      t_00 = (value_type)ptVar1[2]._vptr_token_base;
      ptVar11 = (value_type)ptVar1[3]._vptr_token_base;
      sVar8 = ptVar1[3].line_num;
      ptVar2 = (value_type)ptVar1[4]._vptr_token_base;
      while (ptVar10 = ptVar9, t_00 != ptVar2) {
        ptVar9 = t_00;
        preprocess::anon_class_16_2_05505a5e::operator()
                  (&process,(tree_type<cs::token_base_*> *)t_00);
        t_00 = (value_type)&t_00->line_num;
        if (t_00 == ptVar11) {
          t_00 = *(value_type *)(sVar8 + 8);
          sVar8 = sVar8 + 8;
          ptVar11 = t_00 + 0x20;
        }
      }
    }
    else {
      preprocess::anon_class_16_2_05505a5e::operator()
                (&process,(tree_type<cs::token_base_*> *)ptVar10);
    }
    this_00 = (statement_import *)
              statement_base::operator_new((statement_base *)0x38,(size_t)ptVar10);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>_>_>
    ::vector(&local_48,&var_list);
    std::__shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_58,&context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)
    ;
    pdVar3 = (raw->
             super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
             )._M_impl.super__Deque_impl_data._M_start._M_cur;
    pptVar7 = (pdVar3->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pptVar7 ==
        (pdVar3->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      pptVar7 = (pdVar3->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    statement_import::statement_import(this_00,&local_48,(context_t *)&local_58,pptVar7[-1]);
    local_a0.mData = (tree_node *)this_00;
    std::deque<cs::statement_base*,std::allocator<cs::statement_base*>>::
    emplace_back<cs::statement_import*>
              ((deque<cs::statement_base*,std::allocator<cs::statement_base*>> *)&this->mResult,
               (statement_import **)&local_a0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>_>_>
    ::~vector(&local_48);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>_>_>
    ::~vector(&var_list);
    return;
  }
  this_01 = (internal_error *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string((string *)&var_list,"Null pointer accessed.",(allocator *)&process);
  internal_error::internal_error(this_01,(string *)&var_list);
  __cxa_throw(this_01,&internal_error::typeinfo,internal_error::~internal_error);
}

Assistant:

void method_import::preprocess(const context_t &context, const std::deque<std::deque<token_base *>> &raw)
	{
		tree_type<token_base *> &tree = static_cast<token_expr *>(raw.front().at(1))->get_tree();
		if (tree.root().data() == nullptr)
			throw internal_error("Null pointer accessed.");
		std::vector<std::pair<std::string, var>> var_list;
		auto process = [&context, &var_list](tree_type<token_base *> &t) {
			token_base *token = t.root().data();
			if (token == nullptr || token->get_type() != token_types::id)
				throw compile_error("Wrong grammar for import statement, expect <package name>");
			const var_id &package_name = static_cast<token_id *>(token)->get_id();
			const var &ext = make_namespace(context->instance->import(current_process->import_path, package_name));
			context->compiler->add_constant(ext);
			context->instance->storage.add_var_no_return(package_name, ext);
			var_list.emplace_back(package_name, ext);
		};
		if (tree.root().data()->get_type() == token_types::parallel) {
			auto &parallel_list = static_cast<token_parallel *>(tree.root().data())->get_parallel();
			for (auto &t: parallel_list)
				process(t);
		}
		else
			process(tree);
		mResult.emplace_back(new statement_import(var_list, context, raw.front().back()));
	}